

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int setupLookaside(sqlite3 *db,void *pBuf,int sz,int cnt)

{
  LookasideSlot **ppLVar1;
  int iVar2;
  int iVar3;
  LookasideSlot *pLVar4;
  u32 uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  LookasideSlot *pLVar10;
  u64 n;
  uint uVar11;
  LookasideSlot *p;
  LookasideSlot *pLVar12;
  
  iVar2 = sqlite3LookasideUsed(db,(int *)0x0);
  if (0 < iVar2) {
    return 5;
  }
  if ((db->lookaside).bMalloced != '\0') {
    sqlite3_free((db->lookaside).pStart);
  }
  n = (long)cnt * (long)sz;
  uVar11 = sz & 0xfffffff8;
  uVar8 = uVar11;
  if ((int)uVar11 < 9) {
    uVar8 = 0;
  }
  if (cnt < 1 || (int)uVar11 < 9) {
    pLVar4 = (LookasideSlot *)0x0;
    uVar8 = 0;
  }
  else {
    pLVar4 = (LookasideSlot *)pBuf;
    if (pBuf == (void *)0x0) {
      if (sqlite3Hooks_0 != (code *)0x0) {
        (*sqlite3Hooks_0)();
      }
      pLVar4 = (LookasideSlot *)sqlite3Malloc(n);
      if (sqlite3Hooks_1 != (code *)0x0) {
        (*sqlite3Hooks_1)();
      }
      if (pLVar4 == (LookasideSlot *)0x0) {
        pLVar4 = (LookasideSlot *)0x0;
      }
      else {
        iVar2 = (*sqlite3Config.m.xSize)(pLVar4);
        n = (u64)iVar2;
      }
    }
  }
  if ((int)uVar8 < 0x180) {
    if ((int)uVar8 < 0x100) {
      iVar2 = 0;
      if ((int)uVar8 < 1) {
        iVar3 = 0;
      }
      else {
        iVar3 = (int)((long)n / (long)(ulong)uVar8);
      }
      goto LAB_001224b5;
    }
    uVar11 = uVar8 + 0x80;
  }
  else {
    uVar11 = uVar8 + 0x180;
  }
  iVar3 = (int)((long)n / (long)(ulong)uVar11);
  uVar7 = n - (long)(int)(uVar8 * iVar3);
  uVar6 = (n - (long)(int)(uVar8 * iVar3)) + 0x7f;
  if (-1 < (long)uVar7) {
    uVar6 = uVar7;
  }
  iVar2 = (int)(uVar6 >> 7);
LAB_001224b5:
  (db->lookaside).pStart = pLVar4;
  (db->lookaside).pInit = (LookasideSlot *)0x0;
  (db->lookaside).pFree = (LookasideSlot *)0x0;
  (db->lookaside).sz = (u16)uVar8;
  (db->lookaside).szTrue = (u16)uVar8;
  if (pLVar4 == (LookasideSlot *)0x0) {
    (db->lookaside).pStart = db;
    (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
    (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
    (db->lookaside).pMiddle = db;
    (db->lookaside).pEnd = db;
    (db->lookaside).bDisable = 1;
    (db->lookaside).sz = 0;
    (db->lookaside).bMalloced = '\0';
    uVar5 = 0;
  }
  else {
    if (0 < iVar3) {
      ppLVar1 = &(db->lookaside).pInit;
      pLVar10 = *ppLVar1;
      pLVar12 = pLVar4;
      iVar9 = iVar3;
      do {
        pLVar12->pNext = pLVar10;
        pLVar4 = (LookasideSlot *)((long)&pLVar12->pNext + (long)(int)uVar8);
        iVar9 = iVar9 + -1;
        pLVar10 = pLVar12;
        pLVar12 = pLVar4;
      } while (iVar9 != 0);
      *ppLVar1 = (LookasideSlot *)((long)pLVar4 - (long)(int)uVar8);
    }
    (db->lookaside).pSmallInit = (LookasideSlot *)0x0;
    (db->lookaside).pSmallFree = (LookasideSlot *)0x0;
    (db->lookaside).pMiddle = pLVar4;
    if (0 < iVar2) {
      ppLVar1 = &(db->lookaside).pSmallInit;
      pLVar10 = *ppLVar1;
      iVar9 = iVar2;
      do {
        pLVar12 = pLVar4;
        pLVar12->pNext = pLVar10;
        pLVar4 = pLVar12 + 0x10;
        iVar9 = iVar9 + -1;
        pLVar10 = pLVar12;
      } while (iVar9 != 0);
      *ppLVar1 = pLVar12;
    }
    (db->lookaside).pEnd = pLVar4;
    (db->lookaside).bDisable = 0;
    (db->lookaside).bMalloced = pBuf == (void *)0x0;
    uVar5 = iVar2 + iVar3;
  }
  (db->lookaside).nSlot = uVar5;
  return 0;
}

Assistant:

static int setupLookaside(sqlite3 *db, void *pBuf, int sz, int cnt){
#ifndef SQLITE_OMIT_LOOKASIDE
  void *pStart;
  sqlite3_int64 szAlloc = sz*(sqlite3_int64)cnt;
  int nBig;   /* Number of full-size slots */
  int nSm;    /* Number smaller LOOKASIDE_SMALL-byte slots */

  if( sqlite3LookasideUsed(db,0)>0 ){
    return SQLITE_BUSY;
  }
  /* Free any existing lookaside buffer for this handle before
  ** allocating a new one so we don't have to have space for
  ** both at the same time.
  */
  if( db->lookaside.bMalloced ){
    sqlite3_free(db->lookaside.pStart);
  }
  /* The size of a lookaside slot after ROUNDDOWN8 needs to be larger
  ** than a pointer to be useful.
  */
  sz = ROUNDDOWN8(sz);  /* IMP: R-33038-09382 */
  if( sz<=(int)sizeof(LookasideSlot*) ) sz = 0;
  if( cnt<0 ) cnt = 0;
  if( sz==0 || cnt==0 ){
    sz = 0;
    pStart = 0;
  }else if( pBuf==0 ){
    sqlite3BeginBenignMalloc();
    pStart = sqlite3Malloc( szAlloc );  /* IMP: R-61949-35727 */
    sqlite3EndBenignMalloc();
    if( pStart ) szAlloc = sqlite3MallocSize(pStart);
  }else{
    pStart = pBuf;
  }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
  if( sz>=LOOKASIDE_SMALL*3 ){
    nBig = szAlloc/(3*LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else if( sz>=LOOKASIDE_SMALL*2 ){
    nBig = szAlloc/(LOOKASIDE_SMALL+sz);
    nSm = (szAlloc - sz*nBig)/LOOKASIDE_SMALL;
  }else
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
  if( sz>0 ){
    nBig = szAlloc/sz;
    nSm = 0;
  }else{
    nBig = nSm = 0;
  }
  db->lookaside.pStart = pStart;
  db->lookaside.pInit = 0;
  db->lookaside.pFree = 0;
  db->lookaside.sz = (u16)sz;
  db->lookaside.szTrue = (u16)sz;
  if( pStart ){
    int i;
    LookasideSlot *p;
    assert( sz > (int)sizeof(LookasideSlot*) );
    p = (LookasideSlot*)pStart;
    for(i=0; i<nBig; i++){
      p->pNext = db->lookaside.pInit;
      db->lookaside.pInit = p;
      p = (LookasideSlot*)&((u8*)p)[sz];
    }
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = p;
    for(i=0; i<nSm; i++){
      p->pNext = db->lookaside.pSmallInit;
      db->lookaside.pSmallInit = p;
      p = (LookasideSlot*)&((u8*)p)[LOOKASIDE_SMALL];
    }
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    assert( ((uptr)p)<=szAlloc + (uptr)pStart );
    db->lookaside.pEnd = p;
    db->lookaside.bDisable = 0;
    db->lookaside.bMalloced = pBuf==0 ?1:0;
    db->lookaside.nSlot = nBig+nSm;
  }else{
    db->lookaside.pStart = db;
#ifndef SQLITE_OMIT_TWOSIZE_LOOKASIDE
    db->lookaside.pSmallInit = 0;
    db->lookaside.pSmallFree = 0;
    db->lookaside.pMiddle = db;
#endif /* SQLITE_OMIT_TWOSIZE_LOOKASIDE */
    db->lookaside.pEnd = db;
    db->lookaside.bDisable = 1;
    db->lookaside.sz = 0;
    db->lookaside.bMalloced = 0;
    db->lookaside.nSlot = 0;
  }
  assert( sqlite3LookasideUsed(db,0)==0 );
#endif /* SQLITE_OMIT_LOOKASIDE */
  return SQLITE_OK;
}